

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O1

Pointer<anurbs::BrepTrim> __thiscall
anurbs::Ref<anurbs::BrepTrim>::data(Ref<anurbs::BrepTrim> *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  Pointer<anurbs::BrepTrim> PVar4;
  Pointer<anurbs::BrepTrim> PVar5;
  
  peVar1 = (this->m_entry).
           super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (peVar1->m_data).super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  (in_RDI->m_loop).m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var3._M_pi;
  p_Var2 = (peVar1->m_data).super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (in_RDI->m_loop).m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      PVar4.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      PVar4.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (Pointer<anurbs::BrepTrim>)
             PVar4.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    UNLOCK();
  }
  PVar5.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  PVar5.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Pointer<anurbs::BrepTrim>)
         PVar5.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Pointer<TData> data() const
    {
        return m_entry->data();
    }